

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

bool __thiscall kj::StringPtr::startsWith(StringPtr *this,StringPtr *other)

{
  bool bVar1;
  ArrayPtr<const_char> local_38;
  ArrayPtr<const_char> local_28;
  StringPtr *local_18;
  StringPtr *other_local;
  StringPtr *this_local;
  
  local_18 = other;
  other_local = this;
  local_28 = asArray(this);
  local_38 = operator_cast_to_ArrayPtr(local_18);
  bVar1 = ArrayPtr<const_char>::startsWith(&local_28,&local_38);
  return bVar1;
}

Assistant:

inline constexpr bool startsWith(const StringPtr& other) const { return asArray().startsWith(other);}